

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash-stringify-walker.cpp
# Opt level: O2

vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_> *
wasm::StringifyProcessor::filterOverlaps
          (vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
           *__return_storage_ptr__,
          vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
          *substrings)

{
  pointer puVar1;
  uint *puVar2;
  pointer puVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined1 auVar6 [8];
  size_type __n;
  long lVar7;
  uint *puVar8;
  uint uVar9;
  ulong uVar10;
  Index i;
  undefined1 local_d0 [8];
  vector<int,_std::allocator<int>_> indices;
  vector<int,_std::allocator<int>_> substringIdxs;
  undefined1 auStack_98 [8];
  vector<wasm::Interval,_std::allocator<wasm::Interval>_> intervals;
  undefined1 local_78 [8];
  uint startIdx;
  pointer local_68;
  pointer local_60;
  undefined1 local_58 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  startIndices;
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  *result;
  
  auStack_98 = (undefined1  [8])0x0;
  intervals.super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  intervals.super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar10 = 0;
  startIndices.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)substrings;
  while( true ) {
    puVar1 = ((startIndices.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    __n = (long)((startIndices.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1 >> 5;
    if (__n <= uVar10) break;
    puVar2 = *(uint **)(puVar1 + uVar10 * 8 + 4);
    for (puVar8 = *(uint **)(puVar1 + uVar10 * 8 + 2); puVar8 != puVar2; puVar8 = puVar8 + 1) {
      local_78._0_4_ = *puVar8;
      local_58._0_4_ = local_78._0_4_ + puVar1[uVar10 * 8];
      std::vector<wasm::Interval,std::allocator<wasm::Interval>>::
      emplace_back<unsigned_int&,unsigned_int,unsigned_int_const&>
                ((vector<wasm::Interval,std::allocator<wasm::Interval>> *)auStack_98,
                 (uint *)local_78,(uint *)local_58,puVar1 + uVar10 * 8);
      local_58._0_4_ = (uint)uVar10;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)
                 &indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(int *)local_58);
    }
    uVar10 = (ulong)((uint)uVar10 + 1);
  }
  (__return_storage_ptr__->
  super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_58,__n,(allocator_type *)local_78);
  IntervalProcessor::filterOverlaps
            ((vector<int,_std::allocator<int>_> *)local_d0,
             (vector<wasm::Interval,_std::allocator<wasm::Interval>_> *)auStack_98);
  for (auVar6 = local_d0;
      auVar6 != (undefined1  [8])
                indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; auVar6 = (undefined1  [8])((long)auVar6 + 4)) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage[*(int *)auVar6] * 0x18 +
               CONCAT44(local_58._4_4_,local_58._0_4_)),
               (value_type_conflict2 *)((long)auStack_98 + (long)*(int *)auVar6 * 0xc));
  }
  uVar9 = 0;
  while( true ) {
    uVar10 = (ulong)uVar9;
    lVar4 = CONCAT44(local_58._4_4_,local_58._0_4_);
    if ((ulong)(((long)startIndices.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start - lVar4) / 0x18) <= uVar10) break;
    lVar7 = uVar10 * 0x18;
    puVar1 = *(pointer *)(lVar4 + lVar7);
    puVar3 = *(pointer *)(lVar4 + 8 + lVar7);
    if (4 < (ulong)((long)puVar3 - (long)puVar1)) {
      puVar5 = (undefined8 *)(lVar4 + lVar7);
      local_78._0_4_ =
           ((startIndices.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar10 * 8];
      local_60 = (pointer)puVar5[2];
      *puVar5 = 0;
      puVar5[1] = 0;
      puVar5[2] = 0;
      _startIdx = puVar1;
      local_68 = puVar3;
      std::
      vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
      ::emplace_back<wasm::SuffixTree::RepeatedSubstring>
                (__return_storage_ptr__,(RepeatedSubstring *)local_78);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&startIdx);
    }
    uVar9 = uVar9 + 1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_d0);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_58);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)
             &indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::_Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>::~_Vector_base
            ((_Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_> *)auStack_98);
  return __return_storage_ptr__;
}

Assistant:

std::vector<SuffixTree::RepeatedSubstring> StringifyProcessor::filterOverlaps(
  const std::vector<SuffixTree::RepeatedSubstring>& substrings) {
  // A substring represents a contiguous set of instructions that appear more
  // than once in a Wasm binary. For each appearance of the substring, an
  // Interval is created that lacks a connection back to its originating
  // substring. To fix, upon Interval creation, a second vector is populated
  // with the index of the corresponding substring.
  std::vector<Interval> intervals;
  std::vector<int> substringIdxs;

  // Construct intervals
  for (Index i = 0; i < substrings.size(); i++) {
    auto& substring = substrings[i];
    for (auto startIdx : substring.StartIndices) {
      intervals.emplace_back(
        startIdx, startIdx + substring.Length, substring.Length);
      substringIdxs.push_back(i);
    }
  }

  // Get the overlapping intervals
  std::vector<SuffixTree::RepeatedSubstring> result;
  std::vector<std::vector<Index>> startIndices(substrings.size());
  std::vector<int> indices = IntervalProcessor::filterOverlaps(intervals);
  for (auto i : indices) {
    // i is the idx of the Interval in the intervals vector
    // i in substringIdxs returns the idx of the substring that needs to be
    // included in result
    auto substringIdx = substringIdxs[i];
    startIndices[substringIdx].push_back(intervals[i].start);
  }
  for (Index i = 0; i < startIndices.size(); i++) {
    if (startIndices[i].size() > 1) {
      result.emplace_back(SuffixTree::RepeatedSubstring(
        {substrings[i].Length, std::move(startIndices[i])}));
    }
  }

  return result;
}